

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O3

int get_seek_page_info(stb_vorbis *f,ProbedPage *z)

{
  uint32 uVar1;
  int iVar2;
  int64_t iVar3;
  ulong uVar4;
  int iVar5;
  uint8 header [27];
  uint8 lacing [255];
  int local_148;
  uint32 uStack_142;
  byte local_12e;
  byte local_128 [264];
  
  if (f->stream == (uint8 *)0x0) {
    iVar3 = (*f->f->seek)(f->f->data,0,1);
    uVar1 = (int)iVar3 - f->f_start;
  }
  else {
    uVar1 = (int)f->stream - *(int *)&f->stream_start;
  }
  z->page_start = uVar1;
  iVar5 = 0x1b;
  getn(f,(uint8 *)&local_148,0x1b);
  iVar2 = 0;
  if (local_148 == 0x5367674f) {
    getn(f,local_128,(uint)local_12e);
    if (local_12e != 0) {
      uVar4 = 0;
      iVar5 = 0;
      do {
        iVar5 = iVar5 + (uint)local_128[uVar4];
        uVar4 = uVar4 + 1;
      } while ((uint)local_12e != uVar4);
      iVar5 = iVar5 + 0x1b;
    }
    z->page_end = (uint)local_12e + z->page_start + iVar5;
    z->last_decoded_sample = uStack_142;
    set_file_offset(f,z->page_start);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int get_seek_page_info(stb_vorbis *f, ProbedPage *z)
{
   uint8 header[27], lacing[255];
   int i,len;

   // record where the page starts
   z->page_start = stb_vorbis_get_file_offset(f);

   // parse the header
   getn(f, header, 27);
   if (header[0] != 'O' || header[1] != 'g' || header[2] != 'g' || header[3] != 'S')
      return 0;
   getn(f, lacing, header[26]);

   // determine the length of the payload
   len = 0;
   for (i=0; i < header[26]; ++i)
      len += lacing[i];

   // this implies where the page ends
   z->page_end = z->page_start + 27 + header[26] + len;

   // read the last-decoded sample out of the data
   z->last_decoded_sample = header[6] + (header[7] << 8) + (header[8] << 16) + (header[9] << 24);

   // restore file state to where we were
   set_file_offset(f, z->page_start);
   return 1;
}